

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O2

void * mi_heap_malloc_zero_aligned_at
                 (mi_heap_t *heap,size_t size,size_t alignment,size_t offset,_Bool zero)

{
  ulong uVar1;
  mi_page_t *page;
  void *pvVar2;
  
  uVar1 = alignment - 1;
  if ((alignment ^ uVar1) <= uVar1) {
    return (void *)0x0;
  }
  if ((size < 0x401) && (alignment <= size)) {
    page = *(mi_page_t **)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
    if ((page->free != (mi_block_t *)0x0) && (((long)&page->free->next + offset & uVar1) == 0)) {
      if (!zero) {
        pvVar2 = _mi_page_malloc(heap,page,size);
        return pvVar2;
      }
      pvVar2 = _mi_page_malloc_zero(heap,page,size,true);
      return pvVar2;
    }
  }
  pvVar2 = mi_heap_malloc_zero_aligned_at_generic(heap,size,alignment,offset,zero);
  return pvVar2;
}

Assistant:

static void* mi_heap_malloc_zero_aligned_at(mi_heap_t* const heap, const size_t size, const size_t alignment, const size_t offset, const bool zero) mi_attr_noexcept
{
  // note: we don't require `size > offset`, we just guarantee that the address at offset is aligned regardless of the allocated size.
  if mi_unlikely(alignment == 0 || !_mi_is_power_of_two(alignment)) { // require power-of-two (see <https://en.cppreference.com/w/c/memory/aligned_alloc>)
    #if MI_DEBUG > 0
    _mi_error_message(EOVERFLOW, "aligned allocation requires the alignment to be a power-of-two (size %zu, alignment %zu)\n", size, alignment);
    #endif
    return NULL;
  }

  #if MI_GUARDED
  if (offset==0 && alignment < MI_BLOCK_ALIGNMENT_MAX && mi_heap_malloc_use_guarded(heap,size)) {
    return mi_heap_malloc_guarded_aligned(heap, size, alignment, zero);
  }
  #endif

  // try first if there happens to be a small block available with just the right alignment
  if mi_likely(size <= MI_SMALL_SIZE_MAX && alignment <= size) {
    const uintptr_t align_mask = alignment-1;       // for any x, `(x & align_mask) == (x % alignment)`
    const size_t padsize = size + MI_PADDING_SIZE;
    mi_page_t* page = _mi_heap_get_free_small_page(heap, padsize);
    if mi_likely(page->free != NULL) {
      const bool is_aligned = (((uintptr_t)page->free + offset) & align_mask)==0;
      if mi_likely(is_aligned)
      {
        void* p = (zero ? _mi_page_malloc_zeroed(heap,page,padsize) : _mi_page_malloc(heap,page,padsize)); // call specific page malloc for better codegen
        mi_assert_internal(p != NULL);
        mi_assert_internal(((uintptr_t)p + offset) % alignment == 0);
        mi_track_malloc(p,size,zero);
        return p;
      }
    }